

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

SelectionManager * __thiscall
OpenMD::SelectionManager::removeAtomsInRigidBodies(SelectionManager *this)

{
  StuntDouble *this_00;
  SelectionManager *in_RSI;
  SelectionManager *in_RDI;
  RigidBody *rb;
  Atom *atom;
  iterator ai;
  int isd;
  StuntDouble *sd;
  SelectionSet ssAtoms;
  SelectionManager *tempSeleMan;
  size_t in_stack_ffffffffffffff28;
  StuntDouble *in_stack_ffffffffffffff30;
  RigidBody *in_stack_ffffffffffffff38;
  SelectionManager *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  RigidBody *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  SelectionManager *this_01;
  RigidBody *local_70;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_68 [2];
  StuntDouble *local_58;
  undefined1 local_4d;
  
  this_01 = (SelectionManager *)&stack0xffffffffffffffc0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this_01,
             (vector<int,_std::allocator<int>_> *)in_RSI);
  SelectionSet::SelectionSet((SelectionSet *)this_01,(vector<int,_std::allocator<int>_> *)in_RSI);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40);
  SelectionSet::clearAll((SelectionSet *)in_stack_ffffffffffffff30);
  local_4d = 0;
  SelectionManager(this_01,in_RSI);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(local_68);
  this_00 = beginSelected(in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38);
  local_58 = this_00;
  while (local_58 != (StuntDouble *)0x0) {
    in_stack_ffffffffffffff5f = StuntDouble::isRigidBody(local_58);
    if ((bool)in_stack_ffffffffffffff5f) {
      in_stack_ffffffffffffff50 =
           (RigidBody *)
           RigidBody::beginAtom
                     (in_stack_ffffffffffffff50,
                      (iterator *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_70 = in_stack_ffffffffffffff50;
      while (local_70 != (RigidBody *)0x0) {
        in_stack_ffffffffffffff40 =
             (SelectionManager *)
             std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                       ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                        &stack0xffffffffffffffd8,0);
        in_stack_ffffffffffffff4c = StuntDouble::getGlobalIndex(&local_70->super_StuntDouble);
        OpenMDBitSet::setBitOn((OpenMDBitSet *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff38 =
             (RigidBody *)
             RigidBody::nextAtom(in_stack_ffffffffffffff50,
                                 (iterator *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_70 = in_stack_ffffffffffffff38;
      }
    }
    in_stack_ffffffffffffff30 =
         nextSelected(in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38);
    local_58 = in_stack_ffffffffffffff30;
  }
  SelectionSet::operator-=
            ((SelectionSet *)this_00,
             (SelectionSet *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_4d = 1;
  SelectionSet::~SelectionSet((SelectionSet *)0x20268e);
  return in_RDI;
}

Assistant:

SelectionManager SelectionManager::removeAtomsInRigidBodies() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }
      }
    }

    // Remove the atoms in rigid bodies from our selection set.
    tempSeleMan.ss_ -= ssAtoms;

    return tempSeleMan;
  }